

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateSymbolName
          (DescriptorBuilder *this,string *name,string *full_name,Message *proto)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar2 = name->_M_string_length;
  if (uVar2 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Missing name.",(allocator<char> *)&local_50);
    AddError(this,full_name,proto,NAME,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
      bVar1 = (name->_M_dataplus)._M_p[uVar3];
      if ((char)bVar1 < 'a') {
        if ((char)bVar1 < 'A') {
          if ((byte)(bVar1 - 0x3a) < 0xf6) {
LAB_001e2e35:
            std::operator+(&local_50,"\"",name);
            std::operator+(&local_70,&local_50,"\" is not a valid identifier.");
            AddError(this,full_name,proto,NAME,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_50);
            uVar2 = name->_M_string_length;
          }
        }
        else if (bVar1 != 0x5f && 0x5a < bVar1) goto LAB_001e2e35;
      }
      else if (0x7a < bVar1) goto LAB_001e2e35;
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateSymbolName(
    const string& name, const string& full_name, const Message& proto) {
  if (name.empty()) {
    AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
             "Missing name.");
  } else {
    for (int i = 0; i < name.size(); i++) {
      // I don't trust isalnum() due to locales.  :(
      if ((name[i] < 'a' || 'z' < name[i]) &&
          (name[i] < 'A' || 'Z' < name[i]) &&
          (name[i] < '0' || '9' < name[i]) &&
          (name[i] != '_')) {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
                 "\"" + name + "\" is not a valid identifier.");
      }
    }
  }
}